

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_register_type_op
               (sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp parent,sexp slots,sexp fb,sexp felb,
               sexp flb,sexp flo,sexp fls,sexp sb,sexp so,sexp sc,sexp w,sexp wb,sexp wo,sexp ws,
               sexp we,sexp p,char *fname,sexp_proc2 f)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  sexp ctx_00;
  sexp psVar16;
  sexp in_RCX;
  sexp in_RDX;
  long in_RDI;
  int *in_R8;
  sexp in_R9;
  ulong in_stack_00000008;
  sexp_uint_t type_array_size;
  sexp_uint_t num_types;
  sexp_uint_t len;
  sexp_uint_t i;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp type;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp_conflict *v2;
  sexp_conflict *v1;
  sexp local_a8;
  sexp_uint_t in_stack_ffffffffffffff60;
  sexp in_stack_ffffffffffffff78;
  sexp in_stack_ffffffffffffff80;
  undefined1 *n_00;
  sexp self_00;
  sexp psVar17;
  sexp *local_60;
  undefined8 local_58;
  sexp local_50;
  long local_48;
  char *local_40;
  
  local_50 = (sexp)&DAT_0000043e;
  memset(&local_60,0,0x10);
  psVar17 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffff88,0,0x10);
  uVar1 = *(ulong *)(*(long *)(in_RDI + 0x28) + 0x30);
  auVar2._8_8_ = (long)uVar1 >> 0x3f;
  auVar2._0_8_ = uVar1 & 0xfffffffffffffffe;
  ctx_00 = SUB168(auVar2 / SEXT816(2),0);
  psVar16 = *(sexp *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x20) + 8);
  local_60 = &local_50;
  local_58 = *(undefined8 *)(in_RDI + 0x6080);
  *(sexp ***)(in_RDI + 0x6080) = &local_60;
  n_00 = &stack0xffffffffffffff98;
  self_00 = *(sexp *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff88;
  if (ctx_00 < (sexp)&DAT_ffffffff) {
    if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 9)) {
      if (psVar16 <= ctx_00) {
        in_stack_ffffffffffffff78 = (sexp)((long)psVar16 << 1);
        if ((sexp)&DAT_ffffffff < in_stack_ffffffffffffff78) {
          in_stack_ffffffffffffff78 = (sexp)&DAT_ffffffff;
        }
        local_50 = sexp_make_vector_op(psVar17,self_00,(sexp_sint_t)n_00,in_stack_ffffffffffffff80,
                                       in_stack_ffffffffffffff78);
        if ((((ulong)local_50 & 3) == 0) && (local_50->tag == 0x13)) {
          *(undefined8 *)(in_RDI + 0x6080) = local_58;
          return local_50;
        }
        local_40 = (local_50->value).flonum_bits + 8;
        local_48 = *(long *)(*(long *)(in_RDI + 0x28) + 0x20) + 0x10;
        for (in_stack_ffffffffffffff80 = (sexp)0x0; in_stack_ffffffffffffff80 < ctx_00;
            in_stack_ffffffffffffff80 = (sexp)((long)&in_stack_ffffffffffffff80->tag + 1)) {
          *(undefined8 *)(local_40 + (long)in_stack_ffffffffffffff80 * 8) =
               *(undefined8 *)(local_48 + (long)in_stack_ffffffffffffff80 * 8);
        }
        *(sexp *)(*(long *)(in_RDI + 0x28) + 0x20) = local_50;
      }
      psVar17 = sexp_alloc_tagged_aux(ctx_00,(size_t)psVar16,in_stack_ffffffffffffff60);
      *(sexp *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x20) + 0x10 + (long)ctx_00 * 8) = psVar17;
      psVar17 = *(sexp *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x20) + 0x10 + (long)ctx_00 * 8);
      if ((((ulong)psVar17 & 3) != 0) || (psVar17->tag != 0x13)) {
        psVar17->tag = 1;
        (psVar17->value).type.tag = (sexp_tag_t)ctx_00;
        (psVar17->value).type.slots = in_R9;
        auVar3._8_8_ = (long)in_stack_00000008 >> 0x3f;
        auVar3._0_8_ = in_stack_00000008 & 0xfffffffffffffffe;
        (psVar17->value).type.field_base = SUB162(auVar3 / SEXT816(2),0);
        auVar4._8_8_ = (long)type_array_size >> 0x3f;
        auVar4._0_8_ = type_array_size & 0xfffffffffffffffe;
        (psVar17->value).type.field_eq_len_base = SUB162(auVar4 / SEXT816(2),0);
        auVar5._8_8_ = (long)num_types >> 0x3f;
        auVar5._0_8_ = num_types & 0xfffffffffffffffe;
        (psVar17->value).type.field_len_base = SUB162(auVar5 / SEXT816(2),0);
        auVar6._8_8_ = (long)len >> 0x3f;
        auVar6._0_8_ = len & 0xfffffffffffffffe;
        (psVar17->value).type.field_len_off = SUB162(auVar6 / SEXT816(2),0);
        auVar7._8_8_ = (long)i >> 0x3f;
        auVar7._0_8_ = i & 0xfffffffffffffffe;
        (psVar17->value).type.field_len_scale = SUB162(auVar7 / SEXT816(2),0);
        auVar8._8_8_ = (long)__sexp_gc_preserver2.var >> 0x3f;
        auVar8._0_8_ = (ulong)__sexp_gc_preserver2.var & 0xfffffffffffffffe;
        (psVar17->value).type.size_base = SUB162(auVar8 / SEXT816(2),0);
        auVar9._8_8_ = (long)__sexp_gc_preserver2.next >> 0x3f;
        auVar9._0_8_ = (ulong)__sexp_gc_preserver2.next & 0xfffffffffffffffe;
        (psVar17->value).type.size_off = SUB162(auVar9 / SEXT816(2),0);
        auVar10._8_8_ = (long)type >> 0x3f;
        auVar10._0_8_ = (ulong)type & 0xfffffffffffffffe;
        (psVar17->value).type.size_scale = SUB162(auVar10 / SEXT816(2),0);
        auVar11._8_8_ = (long)__sexp_gc_preserver1.var >> 0x3f;
        auVar11._0_8_ = (ulong)__sexp_gc_preserver1.var & 0xfffffffffffffffe;
        (psVar17->value).type.weak_base = SUB162(auVar11 / SEXT816(2),0);
        auVar12._8_8_ = (long)__sexp_gc_preserver1.next >> 0x3f;
        auVar12._0_8_ = (ulong)__sexp_gc_preserver1.next & 0xfffffffffffffffe;
        (psVar17->value).type.weak_len_base = SUB162(auVar12 / SEXT816(2),0);
        auVar13._8_8_ = (long)res >> 0x3f;
        auVar13._0_8_ = (ulong)res & 0xfffffffffffffffe;
        (psVar17->value).type.weak_len_off = SUB162(auVar13 / SEXT816(2),0);
        auVar14._8_8_ = (long)v2 >> 0x3f;
        auVar14._0_8_ = (ulong)v2 & 0xfffffffffffffffe;
        (psVar17->value).type.weak_len_scale = SUB162(auVar14 / SEXT816(2),0);
        auVar15._8_8_ = (long)v1 >> 0x3f;
        auVar15._0_8_ = (ulong)v1 & 0xfffffffffffffffe;
        (psVar17->value).type.weak_len_extra = SUB162(auVar15 / SEXT816(2),0);
        (psVar17->value).type.name = in_RCX;
        (psVar17->value).bytecode.length = 0x3e;
        (psVar17->value).bytecode.max_depth = 0x3e;
        (psVar17->value).context.heap = (sexp_heap_conflict)name;
        if (parent == (sexp)0x0) {
          psVar16 = (sexp)0x0;
        }
        else {
          psVar16 = sexp_c_string(in_stack_ffffffffffffff78,(char *)ctx_00,(sexp_sint_t)psVar16);
        }
        (psVar17->value).type.finalize_name = psVar16;
        (psVar17->value).type.id = (sexp)0x3e;
        if (name != (sexp)0x0) {
          (psVar17->value).type.dl = *(sexp *)(in_RDI + 0x68);
        }
        (psVar17->value).type.print = slots;
        if (((in_R8 == (int *)0x0) || (((ulong)in_R8 & 3) != 0)) || (*in_R8 != 1)) {
          local_a8 = (sexp)0x0;
          psVar16 = sexp_make_vector_op(psVar17,self_00,(sexp_sint_t)n_00,in_stack_ffffffffffffff80,
                                        (sexp)0x0);
          (psVar17->value).type.cpl = psVar16;
        }
        else {
          if (((*(ulong *)(in_R8 + 4) & 3) == 0) && (**(int **)(in_R8 + 4) == 10)) {
            local_a8 = *(sexp *)(*(long *)(in_R8 + 4) + 8);
          }
          else {
            local_a8 = (sexp)&DAT_00000001;
          }
          psVar16 = sexp_make_vector_op(psVar17,self_00,(sexp_sint_t)n_00,in_stack_ffffffffffffff80,
                                        local_a8);
          (psVar17->value).type.cpl = psVar16;
          if (((in_R8 == (int *)0x0) || ((*(ulong *)(in_R8 + 4) & 3) != 0)) ||
             (**(int **)(in_R8 + 4) != 10)) {
            *(int **)((long)&(psVar17->value).type.cpl[7].value +
                     (long)&local_a8[-1].value * 8 + 0x6088) = in_R8;
          }
          else {
            memcpy((void *)((long)&((psVar17->value).type.cpl)->value + 8),
                   (void *)(*(long *)(in_R8 + 4) + 0x10),(long)local_a8 << 3);
          }
        }
        *(sexp *)((long)&((psVar17->value).type.cpl)->value + (long)local_a8 * 8 + 8) = psVar17;
        (psVar17->value).type.depth = (short)local_a8;
        *(ulong *)(*(long *)(in_RDI + 0x28) + 0x30) = (long)((long)&ctx_00->tag + 1) * 2 | 1;
      }
    }
    else {
      psVar17 = sexp_type_exception(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                    (sexp_uint_t)ctx_00,psVar16);
    }
  }
  else {
    psVar17 = sexp_user_exception(in_RDX,in_RCX,(char *)in_R8,in_R9);
  }
  local_50 = psVar17;
  *(undefined8 *)(in_RDI + 0x6080) = local_58;
  return local_50;
}

Assistant:

sexp sexp_register_type_op (sexp ctx, sexp self, sexp_sint_t n, sexp name,
                            sexp parent, sexp slots,
                            sexp fb, sexp felb, sexp flb, sexp flo, sexp fls,
                            sexp sb, sexp so, sexp sc, sexp w, sexp wb, sexp wo,
                            sexp ws, sexp we, sexp p, const char* fname, sexp_proc2 f) {
  sexp *v1, *v2;
  sexp_gc_var2(res, type);
  sexp_uint_t i, len, num_types=sexp_context_num_types(ctx),
    type_array_size=sexp_context_type_array_size(ctx);
  sexp_gc_preserve2(ctx, res, type);
  if (num_types >= SEXP_MAXIMUM_TYPES) {
    res = sexp_user_exception(ctx, self, "register-type: exceeded maximum type limit", name);
  } else if (! sexp_stringp(name)) {
    res = sexp_type_exception(ctx, self, SEXP_STRING, name);
  } else {
    if (num_types >= type_array_size) {
      len = type_array_size*2;
      if (len > SEXP_MAXIMUM_TYPES) len = SEXP_MAXIMUM_TYPES;
      res = sexp_make_vector(ctx, sexp_make_fixnum(len), SEXP_VOID);
      if (sexp_exceptionp(res)) {
        sexp_gc_release2(ctx);
        return res;
      }
      v1 = sexp_vector_data(res);
      v2 = sexp_vector_data(sexp_global(ctx, SEXP_G_TYPES));
      for (i=0; i<num_types; i++)
        v1[i] = v2[i];
      sexp_global(ctx, SEXP_G_TYPES) = res;
    }
    sexp_type_by_index(ctx, num_types) = sexp_alloc_type(ctx, type, SEXP_TYPE);
    type = sexp_type_by_index(ctx, num_types);
    if (!sexp_exceptionp(type)) {
      sexp_pointer_tag(type) = SEXP_TYPE;
      sexp_type_tag(type) = num_types;
      sexp_type_slots(type) = slots;
      sexp_type_field_base(type) = (short)sexp_unbox_fixnum(fb);
      sexp_type_field_eq_len_base(type) = (short)sexp_unbox_fixnum(felb);
      sexp_type_field_len_base(type) = (short)sexp_unbox_fixnum(flb);
      sexp_type_field_len_off(type) = (short)sexp_unbox_fixnum(flo);
      sexp_type_field_len_scale(type) = (unsigned short)sexp_unbox_fixnum(fls);
      sexp_type_size_base(type) = (short)sexp_unbox_fixnum(sb);
      sexp_type_size_off(type) = (short)sexp_unbox_fixnum(so);
      sexp_type_size_scale(type) = (unsigned short)sexp_unbox_fixnum(sc);
      sexp_type_weak_base(type) = (short)sexp_unbox_fixnum(w);
      sexp_type_weak_len_base(type) = (short)sexp_unbox_fixnum(wb);
      sexp_type_weak_len_off(type) = (short)sexp_unbox_fixnum(wo);
      sexp_type_weak_len_scale(type) = (short)sexp_unbox_fixnum(ws);
      sexp_type_weak_len_extra(type) = (short)sexp_unbox_fixnum(we);
      sexp_type_name(type) = name;
      sexp_type_getters(type) = SEXP_FALSE;
      sexp_type_setters(type) = SEXP_FALSE;
      sexp_type_finalize(type) = f;
      sexp_type_finalize_name(type) = (fname) ? sexp_c_string(ctx, fname, -1) : NULL;
      sexp_type_id(type) = SEXP_FALSE;
#if SEXP_USE_DL
      if (f) sexp_type_dl(type) = sexp_context_dl(ctx);
#endif
      sexp_type_print(type) = p;
      if (parent && sexp_typep(parent)) {
        len = sexp_vectorp(sexp_type_cpl(parent)) ? sexp_vector_length(sexp_type_cpl(parent)) : 1;
        sexp_type_cpl(type) = sexp_make_vector(ctx, sexp_make_fixnum(len+1), SEXP_VOID);
        if (parent && sexp_vectorp(sexp_type_cpl(parent)))
          memcpy(sexp_vector_data(sexp_type_cpl(type)),
                 sexp_vector_data(sexp_type_cpl(parent)),
                 len * sizeof(sexp));
        else
          sexp_vector_data(sexp_type_cpl(type))[len-1] = parent;
      } else {
        len = 0;
        sexp_type_cpl(type) = sexp_make_vector(ctx, SEXP_ONE, SEXP_VOID);
      }
      sexp_vector_data(sexp_type_cpl(type))[len] = type;
      sexp_type_depth(type) = (short)len;
      sexp_global(ctx, SEXP_G_NUM_TYPES) = sexp_make_fixnum(num_types + 1);
    }
    res = type;
  }
  sexp_gc_release2(ctx);
  return res;
}